

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  int *minor;
  byte bVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  ulong uVar4;
  mbedtls_ssl_session *pmVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uchar *puVar15;
  mbedtls_ssl_ciphersuite_t *pmVar16;
  time_t tVar17;
  int *piVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  char *pcVar23;
  uchar *puVar24;
  ushort *puVar25;
  ulong uVar26;
  bool bVar27;
  int major_ver;
  undefined4 uVar28;
  uint local_38;
  uint local_34;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x4f3,"=> parse server hello");
  puVar24 = ssl->in_msg;
  iVar12 = mbedtls_ssl_read_record(ssl);
  if (iVar12 == 0) {
    if (ssl->in_msgtype != 0x16) {
      if (ssl->renego_status == 1) {
        iVar12 = ssl->renego_records_seen;
        ssl->renego_records_seen = iVar12 + 1;
        iVar19 = ssl->conf->renego_max_records;
        if (iVar12 < iVar19 || iVar19 < 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x50c,"non-handshake message during renego");
          return -0x6b00;
        }
        pcVar23 = "renegotiation requested, but not honored by server";
        iVar12 = 0x508;
      }
      else {
        pcVar23 = "bad server hello message";
        iVar12 = 0x511;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar12,pcVar23);
      return -0x7700;
    }
    lVar14 = 4;
    if ((ssl->conf->field_0x164 & 2) == 0) {
LAB_0019cf4f:
      if ((ssl->in_hslen < lVar14 + 0x26U) || (*puVar24 != '\x02')) {
        iVar12 = 0x52b;
        goto LAB_0019cfef;
      }
      puVar24 = puVar24 + lVar14;
      uVar28 = 0;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x53c,"server hello, version",puVar24,2);
      minor = &ssl->minor_ver;
      mbedtls_ssl_read_version
                (&ssl->major_ver,minor,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar24);
      uVar13 = ssl->major_ver;
      pmVar2 = ssl->conf;
      if ((int)uVar13 < (int)(uint)pmVar2->min_major_ver) {
        uVar21 = (uint)pmVar2->min_minor_ver;
        uVar22 = *minor;
      }
      else {
        uVar22 = *minor;
        uVar21 = (uint)pmVar2->min_minor_ver;
        if ((((int)(uint)pmVar2->min_minor_ver <= (int)uVar22) && (uVar13 <= pmVar2->max_major_ver))
           && (uVar22 <= pmVar2->max_minor_ver)) {
          uVar13 = *(uint *)(puVar24 + 2);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x556,"server hello, current time: %lu",
                     (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                            uVar13 << 0x18));
          pmVar3 = ssl->handshake;
          uVar6 = *(undefined8 *)(puVar24 + 2);
          uVar7 = *(undefined8 *)(puVar24 + 10);
          uVar8 = *(undefined8 *)(puVar24 + 0x1a);
          *(undefined8 *)(pmVar3->randbytes + 0x30) = *(undefined8 *)(puVar24 + 0x12);
          *(undefined8 *)(pmVar3->randbytes + 0x38) = uVar8;
          *(undefined8 *)(pmVar3->randbytes + 0x20) = uVar6;
          *(undefined8 *)(pmVar3->randbytes + 0x28) = uVar7;
          bVar1 = puVar24[0x22];
          uVar20 = (ulong)bVar1;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x55d,"server hello, random bytes",puVar24 + 2,0x20);
          if (0x20 < uVar20) {
            iVar12 = 0x561;
            goto LAB_0019cfef;
          }
          uVar4 = ssl->in_hslen;
          uVar26 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
          lVar14 = uVar26 * 8 + 4;
          if (uVar26 * 8 + 0x2b + uVar20 < uVar4) {
            uVar26 = (ulong)(ushort)(*(ushort *)(puVar24 + uVar20 + 0x26) << 8 |
                                    *(ushort *)(puVar24 + uVar20 + 0x26) >> 8);
            if ((uVar26 - 1 < 3) || (uVar4 != lVar14 + uVar20 + uVar26 + 0x28)) {
              iVar12 = 0x56d;
              goto LAB_0019cfef;
            }
          }
          else {
            if (uVar4 != lVar14 + uVar20 + 0x26) {
              iVar12 = 0x577;
              goto LAB_0019cfef;
            }
            uVar26 = 0;
          }
          if (puVar24[uVar20 + 0x25] != '\0') {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x592,"server hello, bad compression: %d");
            return -0x7080;
          }
          uVar13 = (uint)(ushort)(*(ushort *)(puVar24 + uVar20 + 0x23) << 8 |
                                 *(ushort *)(puVar24 + uVar20 + 0x23) >> 8);
          pmVar16 = mbedtls_ssl_ciphersuite_from_id(uVar13);
          ssl->transform_negotiate->ciphersuite_info = pmVar16;
          if (pmVar16 == (mbedtls_ssl_ciphersuite_t *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x59d,"ciphersuite info for %04x not found",uVar13);
            return -0x7100;
          }
          mbedtls_ssl_optimize_checksum(ssl,pmVar16);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5a3,"server hello, session id len.: %d",uVar20);
          puVar15 = puVar24 + 0x23;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5a4,"server hello, session id",puVar15,uVar20);
          pmVar3 = ssl->handshake;
          if ((((pmVar3->resume == 0) || (bVar1 == 0)) ||
              ((ssl->renego_status != 0 ||
               (((pmVar5 = ssl->session_negotiate, pmVar5->ciphersuite != uVar13 ||
                 (pmVar5->compression != 0)) || (pmVar5->id_len != uVar20)))))) ||
             (iVar12 = bcmp(pmVar5->id,puVar15,uVar20), iVar12 != 0)) {
            ssl->state = ssl->state + 1;
            pmVar3->resume = 0;
            tVar17 = time((time_t *)0x0);
            pmVar5 = ssl->session_negotiate;
            pmVar5->start = tVar17;
            pmVar5->ciphersuite = uVar13;
            pmVar5->compression = 0;
            pmVar5->id_len = uVar20;
            memcpy(pmVar5->id,puVar15,uVar20);
          }
          else {
            ssl->state = 0xc;
            iVar12 = mbedtls_ssl_derive_keys(ssl);
            if (iVar12 != 0) {
              pcVar23 = "mbedtls_ssl_derive_keys";
              iVar19 = 0x5c2;
              goto LAB_0019cd2f;
            }
          }
          pcVar23 = "a";
          if (ssl->handshake->resume == 0) {
            pcVar23 = "no";
          }
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5c8,"%s session has been resumed",pcVar23);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5ca,"server hello, chosen ciphersuite: %d",uVar13);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x5cb,"server hello, compress alg.: %d",(ulong)puVar24[uVar20 + 0x25]);
          pmVar16 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
          if ((pmVar16 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
             (((ssl->conf->field_0x164 & 0x40) != 0 && (pmVar16->cipher == MBEDTLS_CIPHER_ARC4_128))
             )) {
            iVar12 = 0x5d5;
          }
          else {
            piVar18 = ssl->conf->ciphersuite_list[*minor];
            do {
              iVar12 = *piVar18;
              if (iVar12 == 0) {
                iVar12 = 0x5de;
                goto LAB_0019cfef;
              }
              piVar18 = piVar18 + 1;
            } while (iVar12 != ssl->session_negotiate->ciphersuite);
            ssl->session_negotiate->compression = 0;
            puVar25 = (ushort *)(puVar24 + uVar20 + 0x28);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5f6,"server hello, total extension length: %d",uVar26);
            bVar9 = false;
            do {
              if (uVar26 == 0) {
                iVar12 = ssl->secure_renegotiation;
                if ((iVar12 == 0) && ((*(uint *)&ssl->conf->field_0x164 & 0x30) == 0x20)) {
                  pcVar23 = "legacy renegotiation, breaking off handshake";
                  iVar12 = 0x680;
                  goto LAB_0019d988;
                }
                if (ssl->renego_status == 1) {
                  if (iVar12 == 1 && !bVar9) {
                    pcVar23 = "renegotiation_info extension missing (secure)";
                    iVar12 = 0x688;
                    goto LAB_0019d988;
                  }
                  if (iVar12 == 0) {
                    if ((ssl->conf->field_0x164 & 0x30) == 0) {
                      pcVar23 = "legacy renegotiation not allowed";
                      iVar12 = 0x68f;
LAB_0019d988:
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                 ,iVar12,pcVar23);
                      iVar12 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                      if (iVar12 == 0) {
                        return -0x7980;
                      }
                      return iVar12;
                    }
                    if (bVar9) {
                      pcVar23 = "renegotiation_info extension present (legacy)";
                      iVar12 = 0x696;
                      goto LAB_0019d988;
                    }
                  }
                }
                pcVar23 = "<= parse server hello";
                iVar12 = 0x6a3;
                goto LAB_0019d162;
              }
              uVar10 = puVar25[1] << 8 | puVar25[1] >> 8;
              uVar20 = (ulong)(uVar10 + 4);
              bVar27 = uVar26 < uVar20;
              uVar26 = uVar26 - uVar20;
              if (bVar27) {
                iVar12 = 0x601;
                goto LAB_0019cfef;
              }
              uVar11 = *puVar25 << 8 | *puVar25 >> 8;
              if (uVar11 < 0x16) {
                if (uVar11 < 0xb) {
                  if (uVar11 == 1) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x615,"found max_fragment_length extension");
                    if (uVar10 != 1) {
                      return -0x7980;
                    }
                    uVar13 = *(uint *)&ssl->conf->field_0x164 >> 7 & 7;
                    if (uVar13 == 0) {
                      return -0x7980;
                    }
                    if (uVar13 != (byte)puVar25[2]) {
                      return -0x7980;
                    }
                  }
                  else {
                    if (uVar11 != 4) goto LAB_0019d88f;
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x622,"found truncated_hmac extension");
                    if (uVar10 != 0) {
                      return -0x7980;
                    }
                    if ((*(uint *)&ssl->conf->field_0x164 & 0x8000) == 0) {
                      return -0x7980;
                    }
                    ssl->session_negotiate->trunc_hmac = 1;
                  }
                }
                else {
                  if (uVar11 == 0xb) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x656,"found supported_point_formats extension");
                    iVar12 = ssl_parse_supported_point_formats_ext
                                       (ssl,(uchar *)(puVar25 + 2),(ulong)uVar10);
                  }
                  else {
                    if (uVar11 != 0x10) goto LAB_0019d88f;
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x663,"found alpn extension");
                    iVar12 = ssl_parse_alpn_ext(ssl,(uchar *)(puVar25 + 2),(ulong)uVar10);
                  }
LAB_0019d830:
                  if (iVar12 != 0) {
                    return iVar12;
                  }
                }
              }
              else {
                uVar13 = (uint)uVar10;
                if (uVar11 < 0x23) {
                  if (uVar11 == 0x16) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x62f,"found encrypt_then_mac extension");
                    if ((ssl->conf->field_0x165 & 4) == 0) {
                      return -0x7980;
                    }
                    if (uVar13 != 0) {
                      return -0x7980;
                    }
                    if (*minor == 0) {
                      return -0x7980;
                    }
                    ssl->session_negotiate->encrypt_then_mac = 1;
                  }
                  else {
                    if (uVar11 != 0x17) goto LAB_0019d88f;
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x63c,"found extended_master_secret extension");
                    if ((ssl->conf->field_0x165 & 8) == 0) {
                      return -0x7980;
                    }
                    if (uVar13 != 0) {
                      return -0x7980;
                    }
                    if (*minor == 0) {
                      return -0x7980;
                    }
                    ssl->handshake->extended_ms = 1;
                  }
                }
                else if (uVar11 == 0x23) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x649,"found session_ticket extension");
                  if (uVar13 != 0) {
                    return -0x7980;
                  }
                  if ((*(uint *)&ssl->conf->field_0x164 & 0x10000) == 0) {
                    return -0x7980;
                  }
                  ssl->handshake->new_session_ticket = 1;
                }
                else {
                  if (uVar11 == 0xff01) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                               ,0x608,"found renegotiation extension");
                    iVar12 = ssl_parse_renegotiation_info(ssl,(uchar *)(puVar25 + 2),(ulong)uVar13);
                    bVar9 = true;
                    goto LAB_0019d830;
                  }
LAB_0019d88f:
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,0x66d,"unknown extension found: %d (ignoring)");
                }
              }
              puVar25 = (ushort *)((long)puVar25 + uVar20);
            } while (2 < uVar26 - 1);
            iVar12 = 0x675;
          }
LAB_0019cfef:
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,iVar12,"bad server hello message");
          return -0x7980;
        }
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x549,
                 "server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                 (ulong)pmVar2->min_major_ver,CONCAT44(uVar28,uVar21),uVar13,uVar22,
                 (uint)pmVar2->max_major_ver,(uint)pmVar2->max_minor_ver);
    }
    else {
      if (*puVar24 != '\x03') {
        free(ssl->handshake->verify_cookie);
        pmVar3 = ssl->handshake;
        pmVar3->verify_cookie = (uchar *)0x0;
        pmVar3->verify_cookie_len = '\0';
        lVar14 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4;
        goto LAB_0019cf4f;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x51a,"received hello verify request");
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x51b,"<= parse server hello");
      puVar24 = ssl->in_msg;
      uVar13 = *(uint *)&ssl->conf->field_0x164 & 2;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4a8,"=> parse hello verify request");
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4b0,"server version",puVar24 + (ulong)uVar13 * 4 + 4,2);
      mbedtls_ssl_read_version
                ((int *)&local_34,(int *)&local_38,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,
                 puVar24 + (ulong)uVar13 * 4 + 4);
      if (((1 < (int)local_38 && 2 < (int)local_34) && (local_34 <= ssl->conf->max_major_ver)) &&
         (local_38 <= ssl->conf->max_minor_ver)) {
        bVar1 = puVar24[(ulong)uVar13 * 4 + 6];
        uVar20 = (ulong)bVar1;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4c6,"cookie",puVar24 + (ulong)uVar13 * 4 + 7,uVar20);
        free(ssl->handshake->verify_cookie);
        puVar15 = (uchar *)calloc(1,uVar20);
        pmVar3 = ssl->handshake;
        pmVar3->verify_cookie = puVar15;
        if (puVar15 == (uchar *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x4cd,"alloc failed (%d bytes)",uVar20);
          return -0x7f00;
        }
        memcpy(puVar15,puVar24 + (ulong)uVar13 * 4 + 7,uVar20);
        pmVar3->verify_cookie_len = bVar1;
        ssl->state = 1;
        mbedtls_ssl_reset_checksum(ssl);
        mbedtls_ssl_recv_flight_completed(ssl);
        pcVar23 = "<= parse hello verify request";
        iVar12 = 0x4da;
LAB_0019d162:
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,iVar12,pcVar23);
        return 0;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4bd,"bad server version");
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','F');
    iVar12 = -0x6e80;
  }
  else {
    pcVar23 = "mbedtls_ssl_read_record";
    iVar19 = 0x4f9;
LAB_0019cd2f:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar19,pcVar23,iVar12);
  }
  return iVar12;
}

Assistant:

static int ssl_parse_server_hello( mbedtls_ssl_context *ssl )
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_ZLIB_SUPPORT)
    int accept_comp;
#endif
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;
#if defined(MBEDTLS_DEBUG_C)
    uint32_t t;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello" ) );

    buf = ssl->in_msg;

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
        {
            ssl->renego_records_seen++;

            if( ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                    "but not honored by server" ) );
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-handshake message during renego" ) );
            return( MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO );
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "received hello verify request" ) );
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello" ) );
            return( ssl_parse_hello_verify_request( ssl ) );
        }
        else
        {
            /* We made it through the verification process */
            mbedtls_free( ssl->handshake->verify_cookie );
            ssl->handshake->verify_cookie = NULL;
            ssl->handshake->verify_cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if( ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len( ssl ) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len( ssl );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, version", buf + 0, 2 );
    mbedtls_ssl_read_version( &ssl->major_ver, &ssl->minor_ver,
                      ssl->conf->transport, buf + 0 );

    if( ssl->major_ver < ssl->conf->min_major_ver ||
        ssl->minor_ver < ssl->conf->min_minor_ver ||
        ssl->major_ver > ssl->conf->max_major_ver ||
        ssl->minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server version out of bounds - "
                            " min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                            ssl->conf->min_major_ver, ssl->conf->min_minor_ver,
                            ssl->major_ver, ssl->minor_ver,
                            ssl->conf->max_major_ver, ssl->conf->max_minor_ver ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

#if defined(MBEDTLS_DEBUG_C)
    t = ( (uint32_t) buf[2] << 24 )
      | ( (uint32_t) buf[3] << 16 )
      | ( (uint32_t) buf[4] <<  8 )
      | ( (uint32_t) buf[5]       );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#endif

    memcpy( ssl->handshake->randbytes + 32, buf + 2, 32 );

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, random bytes", buf + 2, 32 );

    if( n > 32 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    if( ssl->in_hslen > mbedtls_ssl_hs_hdr_len( ssl ) + 39 + n )
    {
        ext_len = ( ( buf[38 + n] <<  8 )
                  | ( buf[39 + n]       ) );

        if( ( ext_len > 0 && ext_len < 4 ) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 40 + n + ext_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else if( ssl->in_hslen == mbedtls_ssl_hs_hdr_len( ssl ) + 38 + n )
    {
        ext_len = 0;
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* ciphersuite (used later) */
    i = ( buf[35 + n] << 8 ) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

#if defined(MBEDTLS_ZLIB_SUPPORT)
    /* See comments in ssl_write_client_hello() */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        accept_comp = 0;
    else
#endif
        accept_comp = 1;

    if( comp != MBEDTLS_SSL_COMPRESS_NULL &&
        ( comp != MBEDTLS_SSL_COMPRESS_DEFLATE || accept_comp == 0 ) )
#else /* MBEDTLS_ZLIB_SUPPORT */
    if( comp != MBEDTLS_SSL_COMPRESS_NULL )
#endif/* MBEDTLS_ZLIB_SUPPORT */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server hello, bad compression: %d", comp ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * Initialize update checksum functions
     */
    ssl->transform_negotiate->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id( i );

    if( ssl->transform_negotiate->ciphersuite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ciphersuite info for %04x not found", i ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    mbedtls_ssl_optimize_checksum( ssl, ssl->transform_negotiate->ciphersuite_info );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 35, n );

    /*
     * Check if the session can be resumed
     */
    if( ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->compression != comp ||
        ssl->session_negotiate->id_len != n ||
        memcmp( ssl->session_negotiate->id, buf + 35, n ) != 0 )
    {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = time( NULL );
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->compression = comp;
        ssl->session_negotiate->id_len = n;
        memcpy( ssl->session_negotiate->id, buf + 35, n );
    }